

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O0

char get_and_check(Translation_Data *translation_data,KEYWORDS kw)

{
  void *__ptr;
  token *hold_token;
  KEYWORDS kw_local;
  Translation_Data *translation_data_local;
  
  if (translation_data->tokens->size == 0) {
    translation_data_local._7_1_ = '\0';
  }
  else if (*translation_data->tokens->first->data == kw) {
    __ptr = Queue_Pop(translation_data->tokens);
    free(__ptr);
    translation_data_local._7_1_ = '\x01';
  }
  else {
    translation_data_local._7_1_ = '\0';
  }
  return translation_data_local._7_1_;
}

Assistant:

char get_and_check(struct Translation_Data *translation_data,enum KEYWORDS kw)
{
	struct token *hold_token;
	if(translation_data->tokens->size==0)
	{
		return 0;
	}else
	{
		hold_token=translation_data->tokens->first->data;
		if(hold_token->type!=kw)
		{
			return 0;
		}else
		{
			hold_token=Queue_Pop(translation_data->tokens);
			free(hold_token);
			return 1;
		}
	}
}